

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
                  *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->b).m_string.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->b).m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)this);
  return;
}

Assistant:

~QStringBuilder() = default;